

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.c
# Opt level: O2

int yy_get_next_buffer(void)

{
  uint uVar1;
  FILE *__stream;
  char *pcVar2;
  char *pcVar3;
  int *piVar4;
  size_t sVar5;
  char *pcVar6;
  uint uVar7;
  long lVar8;
  int iVar9;
  int iVar10;
  ulong uVar11;
  uint uVar12;
  ulong uVar13;
  YY_BUFFER_STATE pyVar14;
  int iVar15;
  YY_BUFFER_STATE *ppyVar16;
  size_t sVar17;
  
  pcVar2 = yytext;
  pcVar3 = yy_c_buf_p;
  sVar17 = yy_buffer_stack_top;
  ppyVar16 = yy_buffer_stack;
  pcVar6 = yy_buffer_stack[yy_buffer_stack_top]->yy_ch_buf;
  if (pcVar6 + (long)yy_n_chars + 1 < yy_c_buf_p) {
    yy_fatal_error("fatal flex scanner internal error--end of buffer missed");
  }
  if (yy_buffer_stack[yy_buffer_stack_top]->yy_fill_buffer == 0) {
    return ((long)yy_c_buf_p - (long)yytext != 1) + 1;
  }
  lVar8 = 0;
  uVar12 = (uint)(yy_c_buf_p + ~(ulong)yytext);
  uVar11 = 0;
  if (0 < (int)uVar12) {
    uVar11 = (ulong)(yy_c_buf_p + ~(ulong)yytext) & 0xffffffff;
  }
  for (; (int)uVar11 != (int)lVar8; lVar8 = lVar8 + 1) {
    pcVar6[lVar8] = pcVar2[lVar8];
  }
  pyVar14 = ppyVar16[sVar17];
  if (pyVar14->yy_buffer_status == 2) {
    yy_n_chars = 0;
    pyVar14->yy_n_chars = 0;
  }
  else {
    while( true ) {
      iVar9 = pyVar14->yy_buf_size;
      uVar7 = iVar9 + ~uVar12;
      if (0 < (int)uVar7) break;
      if (pyVar14->yy_is_our_buffer == 0) {
        pyVar14->yy_ch_buf = (char *)0x0;
LAB_00105a62:
        yy_fatal_error("fatal error - scanner input buffer overflow");
      }
      iVar10 = -((uint)-iVar9 >> 3);
      if (0 < iVar9) {
        iVar10 = iVar9;
      }
      pcVar6 = pyVar14->yy_ch_buf;
      pyVar14->yy_buf_size = iVar9 + iVar10;
      pcVar2 = (char *)realloc(pcVar6,(long)(iVar9 + iVar10 + 2));
      pyVar14->yy_ch_buf = pcVar2;
      if (pcVar2 == (char *)0x0) goto LAB_00105a62;
      pcVar3 = pcVar2 + ((int)pcVar3 - (int)pcVar6);
      pyVar14 = ppyVar16[sVar17];
      yy_c_buf_p = pcVar3;
    }
    uVar1 = 0x2000;
    if (uVar7 < 0x2000) {
      uVar1 = uVar7;
    }
    uVar11 = (ulong)uVar1;
    if (pyVar14->yy_is_interactive == 0) {
      piVar4 = __errno_location();
      *piVar4 = 0;
      while( true ) {
        sVar5 = fread(pyVar14->yy_ch_buf + (int)uVar12,1,uVar11,(FILE *)yyin);
        __stream = yyin;
        iVar9 = (int)sVar5;
        iVar10 = iVar9;
        if (iVar9 != 0) break;
        yy_n_chars = iVar9;
        iVar9 = ferror((FILE *)yyin);
        if (iVar9 == 0) {
          iVar9 = 0;
          iVar10 = yy_n_chars;
          break;
        }
        if (*piVar4 != 4) goto LAB_00105a6e;
        *piVar4 = 0;
        clearerr((FILE *)__stream);
        pyVar14 = yy_buffer_stack[yy_buffer_stack_top];
      }
    }
    else {
      iVar15 = 0x2a;
      for (uVar13 = 0; uVar11 != uVar13; uVar13 = uVar13 + 1) {
        iVar15 = getc((FILE *)yyin);
        if ((iVar15 == -1) || (iVar15 == 10)) {
          uVar11 = uVar13 & 0xffffffff;
          break;
        }
        yy_buffer_stack[yy_buffer_stack_top]->yy_ch_buf[uVar13 + (long)(int)uVar12] = (char)iVar15;
      }
      iVar9 = (int)uVar11;
      iVar10 = iVar9;
      if (iVar15 == -1) {
        iVar15 = ferror((FILE *)yyin);
        if (iVar15 != 0) {
LAB_00105a6e:
          yy_fatal_error("input in flex scanner failed");
        }
      }
      else if (iVar15 == 10) {
        iVar9 = iVar9 + 1;
        yy_buffer_stack[yy_buffer_stack_top]->yy_ch_buf[uVar11 + (long)(int)uVar12] = '\n';
        iVar10 = iVar9;
      }
    }
    yy_n_chars = iVar10;
    sVar17 = yy_buffer_stack_top;
    ppyVar16 = yy_buffer_stack;
    pyVar14 = yy_buffer_stack[yy_buffer_stack_top];
    pyVar14->yy_n_chars = iVar9;
    iVar10 = 0;
    if (iVar9 != 0) goto LAB_001059de;
  }
  if (uVar12 == 0) {
    yyrestart(yyin);
    pyVar14 = yy_buffer_stack[yy_buffer_stack_top];
    iVar10 = 1;
    ppyVar16 = yy_buffer_stack;
    sVar17 = yy_buffer_stack_top;
    iVar9 = yy_n_chars;
  }
  else {
    pyVar14->yy_buffer_status = 2;
    iVar10 = 2;
    iVar9 = 0;
  }
LAB_001059de:
  iVar15 = iVar9 + uVar12;
  if (pyVar14->yy_buf_size < iVar15) {
    iVar9 = (iVar9 >> 1) + iVar15;
    pcVar6 = (char *)realloc(pyVar14->yy_ch_buf,(long)iVar9);
    ppyVar16[sVar17]->yy_ch_buf = pcVar6;
    pcVar6 = ppyVar16[sVar17]->yy_ch_buf;
    if (pcVar6 == (char *)0x0) {
      yy_fatal_error("out of dynamic memory in yy_get_next_buffer()");
    }
    ppyVar16[sVar17]->yy_buf_size = iVar9 + -2;
  }
  else {
    pcVar6 = pyVar14->yy_ch_buf;
  }
  yy_n_chars = iVar15;
  pcVar6[iVar15] = '\0';
  ppyVar16[sVar17]->yy_ch_buf[(long)iVar15 + 1] = '\0';
  yytext = ppyVar16[sVar17]->yy_ch_buf;
  return iVar10;
}

Assistant:

static int yy_get_next_buffer (void)
{
    	char *dest = YY_CURRENT_BUFFER_LVALUE->yy_ch_buf;
	char *source = (yytext_ptr);
	int number_to_move, i;
	int ret_val;

	if ( (yy_c_buf_p) > &YY_CURRENT_BUFFER_LVALUE->yy_ch_buf[(yy_n_chars) + 1] )
		YY_FATAL_ERROR(
		"fatal flex scanner internal error--end of buffer missed" );

	if ( YY_CURRENT_BUFFER_LVALUE->yy_fill_buffer == 0 )
		{ /* Don't try to fill the buffer, so this is an EOF. */
		if ( (yy_c_buf_p) - (yytext_ptr) - YY_MORE_ADJ == 1 )
			{
			/* We matched a single character, the EOB, so
			 * treat this as a final EOF.
			 */
			return EOB_ACT_END_OF_FILE;
			}

		else
			{
			/* We matched some text prior to the EOB, first
			 * process it.
			 */
			return EOB_ACT_LAST_MATCH;
			}
		}

	/* Try to read more data. */

	/* First move last chars to start of buffer. */
	number_to_move = (int) ((yy_c_buf_p) - (yytext_ptr) - 1);

	for ( i = 0; i < number_to_move; ++i )
		*(dest++) = *(source++);

	if ( YY_CURRENT_BUFFER_LVALUE->yy_buffer_status == YY_BUFFER_EOF_PENDING )
		/* don't do the read, it's not guaranteed to return an EOF,
		 * just force an EOF
		 */
		YY_CURRENT_BUFFER_LVALUE->yy_n_chars = (yy_n_chars) = 0;

	else
		{
			int num_to_read =
			YY_CURRENT_BUFFER_LVALUE->yy_buf_size - number_to_move - 1;

		while ( num_to_read <= 0 )
			{ /* Not enough room in the buffer - grow it. */

			/* just a shorter name for the current buffer */
			YY_BUFFER_STATE b = YY_CURRENT_BUFFER_LVALUE;

			int yy_c_buf_p_offset =
				(int) ((yy_c_buf_p) - b->yy_ch_buf);

			if ( b->yy_is_our_buffer )
				{
				int new_size = b->yy_buf_size * 2;

				if ( new_size <= 0 )
					b->yy_buf_size += b->yy_buf_size / 8;
				else
					b->yy_buf_size *= 2;

				b->yy_ch_buf = (char *)
					/* Include room in for 2 EOB chars. */
					yyrealloc( (void *) b->yy_ch_buf,
							 (yy_size_t) (b->yy_buf_size + 2)  );
				}
			else
				/* Can't grow it, we don't own it. */
				b->yy_ch_buf = NULL;

			if ( ! b->yy_ch_buf )
				YY_FATAL_ERROR(
				"fatal error - scanner input buffer overflow" );

			(yy_c_buf_p) = &b->yy_ch_buf[yy_c_buf_p_offset];

			num_to_read = YY_CURRENT_BUFFER_LVALUE->yy_buf_size -
						number_to_move - 1;

			}

		if ( num_to_read > YY_READ_BUF_SIZE )
			num_to_read = YY_READ_BUF_SIZE;

		/* Read in more data. */
		YY_INPUT( (&YY_CURRENT_BUFFER_LVALUE->yy_ch_buf[number_to_move]),
			(yy_n_chars), num_to_read );

		YY_CURRENT_BUFFER_LVALUE->yy_n_chars = (yy_n_chars);
		}

	if ( (yy_n_chars) == 0 )
		{
		if ( number_to_move == YY_MORE_ADJ )
			{
			ret_val = EOB_ACT_END_OF_FILE;
			yyrestart( yyin  );
			}

		else
			{
			ret_val = EOB_ACT_LAST_MATCH;
			YY_CURRENT_BUFFER_LVALUE->yy_buffer_status =
				YY_BUFFER_EOF_PENDING;
			}
		}

	else
		ret_val = EOB_ACT_CONTINUE_SCAN;

	if (((yy_n_chars) + number_to_move) > YY_CURRENT_BUFFER_LVALUE->yy_buf_size) {
		/* Extend the array by 50%, plus the number we really need. */
		int new_size = (yy_n_chars) + number_to_move + ((yy_n_chars) >> 1);
		YY_CURRENT_BUFFER_LVALUE->yy_ch_buf = (char *) yyrealloc(
			(void *) YY_CURRENT_BUFFER_LVALUE->yy_ch_buf, (yy_size_t) new_size  );
		if ( ! YY_CURRENT_BUFFER_LVALUE->yy_ch_buf )
			YY_FATAL_ERROR( "out of dynamic memory in yy_get_next_buffer()" );
		/* "- 2" to take care of EOB's */
		YY_CURRENT_BUFFER_LVALUE->yy_buf_size = (int) (new_size - 2);
	}

	(yy_n_chars) += number_to_move;
	YY_CURRENT_BUFFER_LVALUE->yy_ch_buf[(yy_n_chars)] = YY_END_OF_BUFFER_CHAR;
	YY_CURRENT_BUFFER_LVALUE->yy_ch_buf[(yy_n_chars) + 1] = YY_END_OF_BUFFER_CHAR;

	(yytext_ptr) = &YY_CURRENT_BUFFER_LVALUE->yy_ch_buf[0];

	return ret_val;
}